

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_16_2t_pixels(__m256i *s0,__m256i *s1,__m256i *sig)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i r1;
  __m256i r0;
  __m256i x1;
  __m256i x0;
  __m256i sf2;
  __m256i idx;
  
  auVar1[8] = '\n';
  auVar1[9] = '\v';
  auVar1[10] = '\f';
  auVar1[0xb] = '\r';
  auVar1[0xc] = '\f';
  auVar1[0xd] = '\r';
  auVar1[0xe] = '\x0e';
  auVar1[0xf] = '\x0f';
  auVar1[0] = '\x06';
  auVar1[1] = '\a';
  auVar1[2] = '\b';
  auVar1[3] = '\t';
  auVar1[4] = '\b';
  auVar1[5] = '\t';
  auVar1[6] = '\n';
  auVar1[7] = '\v';
  auVar1[0x10] = '\x06';
  auVar1[0x11] = '\a';
  auVar1[0x12] = '\b';
  auVar1[0x13] = '\t';
  auVar1[0x14] = '\b';
  auVar1[0x15] = '\t';
  auVar1[0x16] = '\n';
  auVar1[0x17] = '\v';
  auVar1[0x18] = '\n';
  auVar1[0x19] = '\v';
  auVar1[0x1a] = '\f';
  auVar1[0x1b] = '\r';
  auVar1[0x1c] = '\f';
  auVar1[0x1d] = '\r';
  auVar1[0x1e] = '\x0e';
  auVar1[0x1f] = '\x0f';
  auVar1 = vpshufb_avx2(*in_RDI,auVar1);
  auVar2[8] = '\n';
  auVar2[9] = '\v';
  auVar2[10] = '\f';
  auVar2[0xb] = '\r';
  auVar2[0xc] = '\f';
  auVar2[0xd] = '\r';
  auVar2[0xe] = '\x0e';
  auVar2[0xf] = '\x0f';
  auVar2[0] = '\x06';
  auVar2[1] = '\a';
  auVar2[2] = '\b';
  auVar2[3] = '\t';
  auVar2[4] = '\b';
  auVar2[5] = '\t';
  auVar2[6] = '\n';
  auVar2[7] = '\v';
  auVar2[0x10] = '\x06';
  auVar2[0x11] = '\a';
  auVar2[0x12] = '\b';
  auVar2[0x13] = '\t';
  auVar2[0x14] = '\b';
  auVar2[0x15] = '\t';
  auVar2[0x16] = '\n';
  auVar2[0x17] = '\v';
  auVar2[0x18] = '\n';
  auVar2[0x19] = '\v';
  auVar2[0x1a] = '\f';
  auVar2[0x1b] = '\r';
  auVar2[0x1c] = '\f';
  auVar2[0x1d] = '\r';
  auVar2[0x1e] = '\x0e';
  auVar2[0x1f] = '\x0f';
  auVar2 = vpshufb_avx2(*in_RSI,auVar2);
  auVar3._8_4_ = 4;
  auVar3._12_4_ = 5;
  auVar3._0_4_ = 2;
  auVar3._4_4_ = 3;
  auVar3._16_4_ = 2;
  auVar3._20_4_ = 3;
  auVar3._24_4_ = 4;
  auVar3._28_4_ = 5;
  auVar3 = vpermd_avx2(auVar3,*in_RDI);
  auVar4._8_4_ = 4;
  auVar4._12_4_ = 5;
  auVar4._0_4_ = 2;
  auVar4._4_4_ = 3;
  auVar4._16_4_ = 2;
  auVar4._20_4_ = 3;
  auVar4._24_4_ = 4;
  auVar4._28_4_ = 5;
  auVar4 = vpermd_avx2(auVar4,*in_RSI);
  auVar6[8] = '\n';
  auVar6[9] = '\v';
  auVar6[10] = '\f';
  auVar6[0xb] = '\r';
  auVar6[0xc] = '\f';
  auVar6[0xd] = '\r';
  auVar6[0xe] = '\x0e';
  auVar6[0xf] = '\x0f';
  auVar6[0] = '\x06';
  auVar6[1] = '\a';
  auVar6[2] = '\b';
  auVar6[3] = '\t';
  auVar6[4] = '\b';
  auVar6[5] = '\t';
  auVar6[6] = '\n';
  auVar6[7] = '\v';
  auVar6[0x10] = '\x06';
  auVar6[0x11] = '\a';
  auVar6[0x12] = '\b';
  auVar6[0x13] = '\t';
  auVar6[0x14] = '\b';
  auVar6[0x15] = '\t';
  auVar6[0x16] = '\n';
  auVar6[0x17] = '\v';
  auVar6[0x18] = '\n';
  auVar6[0x19] = '\v';
  auVar6[0x1a] = '\f';
  auVar6[0x1b] = '\r';
  auVar6[0x1c] = '\f';
  auVar6[0x1d] = '\r';
  auVar6[0x1e] = '\x0e';
  auVar6[0x1f] = '\x0f';
  auVar3 = vpshufb_avx2(auVar3,auVar6);
  auVar5[8] = '\n';
  auVar5[9] = '\v';
  auVar5[10] = '\f';
  auVar5[0xb] = '\r';
  auVar5[0xc] = '\f';
  auVar5[0xd] = '\r';
  auVar5[0xe] = '\x0e';
  auVar5[0xf] = '\x0f';
  auVar5[0] = '\x06';
  auVar5[1] = '\a';
  auVar5[2] = '\b';
  auVar5[3] = '\t';
  auVar5[4] = '\b';
  auVar5[5] = '\t';
  auVar5[6] = '\n';
  auVar5[7] = '\v';
  auVar5[0x10] = '\x06';
  auVar5[0x11] = '\a';
  auVar5[0x12] = '\b';
  auVar5[0x13] = '\t';
  auVar5[0x14] = '\b';
  auVar5[0x15] = '\t';
  auVar5[0x16] = '\n';
  auVar5[0x17] = '\v';
  auVar5[0x18] = '\n';
  auVar5[0x19] = '\v';
  auVar5[0x1a] = '\f';
  auVar5[0x1b] = '\r';
  auVar5[0x1c] = '\f';
  auVar5[0x1d] = '\r';
  auVar5[0x1e] = '\x0e';
  auVar5[0x1f] = '\x0f';
  auVar4 = vpshufb_avx2(auVar4,auVar5);
  auVar1 = vperm2i128_avx2(auVar1,auVar2,0x20);
  *in_RDX = auVar1;
  auVar1 = vperm2i128_avx2(auVar3,auVar4,0x20);
  in_RDX[1] = auVar1;
  return;
}

Assistant:

static inline void pack_16_2t_pixels(const __m256i *s0, const __m256i *s1,
                                     __m256i *sig) {
  const __m256i idx = _mm256_loadu_si256((const __m256i *)signal_index);
  const __m256i sf2 = _mm256_loadu_si256((const __m256i *)signal_pattern_2);
  __m256i x0 = _mm256_shuffle_epi8(*s0, sf2);
  __m256i x1 = _mm256_shuffle_epi8(*s1, sf2);
  __m256i r0 = _mm256_permutevar8x32_epi32(*s0, idx);
  __m256i r1 = _mm256_permutevar8x32_epi32(*s1, idx);
  r0 = _mm256_shuffle_epi8(r0, sf2);
  r1 = _mm256_shuffle_epi8(r1, sf2);
  sig[0] = _mm256_permute2x128_si256(x0, x1, 0x20);
  sig[1] = _mm256_permute2x128_si256(r0, r1, 0x20);
}